

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O2

void __thiscall jbcoin::STAmount::canonicalize(STAmount *this)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  
  bVar1 = beast::operator==(&this->mIssue);
  if (bVar1) {
    this->mIsNative = true;
    uVar2 = this->mValue;
    if (uVar2 != 0) {
      iVar3 = this->mOffset;
      while (iVar3 < 0) {
        uVar2 = uVar2 / 10;
        this->mValue = uVar2;
        iVar3 = iVar3 + 1;
        this->mOffset = iVar3;
      }
      while (0 < iVar3) {
        uVar2 = uVar2 * 10;
        this->mValue = uVar2;
        iVar3 = iVar3 + -1;
        this->mOffset = iVar3;
      }
      if (uVar2 < 0x16345785d8a0001) {
        return;
      }
      Throw<std::runtime_error,char_const(&)[36]>
                ((char (*) [36])"Native currency amount out of range");
    }
    this->mOffset = 0;
  }
  else {
    this->mIsNative = false;
    uVar2 = this->mValue;
    if (uVar2 != 0) {
      iVar3 = this->mOffset;
      while ((uVar2 < 1000000000000000 && (-0x60 < iVar3))) {
        uVar2 = uVar2 * 10;
        this->mValue = uVar2;
        iVar3 = iVar3 + -1;
        this->mOffset = iVar3;
      }
      while (9999999999999999 < uVar2) {
        if (0x4f < iVar3) goto LAB_001d7450;
        uVar2 = uVar2 / 10;
        this->mValue = uVar2;
        iVar3 = iVar3 + 1;
        this->mOffset = iVar3;
      }
      if (uVar2 < 1000000000000000 || iVar3 < -0x60) {
        this->mValue = 0;
        this->mIsNegative = false;
        this->mOffset = -100;
        return;
      }
      if (iVar3 < 0x51) {
        return;
      }
LAB_001d7450:
      Throw<std::runtime_error,char_const(&)[15]>((char (*) [15])0x28ede5);
    }
    this->mOffset = -100;
  }
  this->mIsNegative = false;
  return;
}

Assistant:

void STAmount::canonicalize ()
{
    if (isXRP (*this))
    {
        // native currency amounts should always have an offset of zero
        mIsNative = true;

        if (mValue == 0)
        {
            mOffset = 0;
            mIsNegative = false;
            return;
        }

        while (mOffset < 0)
        {
            mValue /= 10;
            ++mOffset;
        }

        while (mOffset > 0)
        {
            mValue *= 10;
            --mOffset;
        }

        if (mValue > cMaxNativeN)
            Throw<std::runtime_error> ("Native currency amount out of range");

        return;
    }

    mIsNative = false;

    if (mValue == 0)
    {
        mOffset = -100;
        mIsNegative = false;
        return;
    }

    while ((mValue < cMinValue) && (mOffset > cMinOffset))
    {
        mValue *= 10;
        --mOffset;
    }

    while (mValue > cMaxValue)
    {
        if (mOffset >= cMaxOffset)
            Throw<std::runtime_error> ("value overflow");

        mValue /= 10;
        ++mOffset;
    }

    if ((mOffset < cMinOffset) || (mValue < cMinValue))
    {
        mValue = 0;
        mIsNegative = false;
        mOffset = -100;
        return;
    }

    if (mOffset > cMaxOffset)
        Throw<std::runtime_error> ("value overflow");

    assert ((mValue == 0) || ((mValue >= cMinValue) && (mValue <= cMaxValue)));
    assert ((mValue == 0) || ((mOffset >= cMinOffset) && (mOffset <= cMaxOffset)));
    assert ((mValue != 0) || (mOffset != -100));
}